

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcwrite.c
# Opt level: O0

void bcwrite_proto(BCWriteCtx *ctx,GCproto *pt)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  char *q;
  MSize nn;
  MSize n_1;
  GCobj *o;
  GCRef *kr;
  ptrdiff_t n;
  ptrdiff_t i;
  char *p;
  MSize sizedbg;
  GCproto *pt_local;
  BCWriteCtx *ctx_local;
  char *local_58;
  char *local_10;
  
  p._4_4_ = 0;
  if ((pt->flags & 1) != 0) {
    uVar2 = pt->sizekgc;
    o = (GCobj *)(pt->k).ptr64;
    for (n = 0; o = (GCobj *)((long)o - 8), n < (long)(ulong)uVar2; n = n + 1) {
      if ((*(GCproto **)o)->gct == '\a') {
        bcwrite_proto(ctx,*(GCproto **)o);
      }
    }
  }
  uVar2 = (pt->sizebc - 1) * 4 + 0x27 + (uint)pt->sizeuv * 2;
  if ((uint)((int)(ctx->sb).e - (int)(ctx->sb).b) < uVar2) {
    local_58 = lj_buf_need2(&ctx->sb,uVar2);
  }
  else {
    local_58 = (ctx->sb).b;
  }
  local_58[5] = pt->flags & 7;
  local_58[6] = pt->numparams;
  local_58[7] = pt->framesize;
  local_58[8] = pt->sizeuv;
  pcVar4 = lj_strfmt_wuleb128(local_58 + 9,pt->sizekgc);
  pcVar4 = lj_strfmt_wuleb128(pcVar4,pt->sizekn);
  i = (ptrdiff_t)lj_strfmt_wuleb128(pcVar4,pt->sizebc - 1);
  if (ctx->strip == 0) {
    if ((pt->lineinfo).ptr64 != 0) {
      p._4_4_ = pt->sizept - ((int)(pt->lineinfo).ptr64 - (int)pt);
    }
    i = (ptrdiff_t)lj_strfmt_wuleb128((char *)i,p._4_4_);
    if (p._4_4_ != 0) {
      pcVar4 = lj_strfmt_wuleb128((char *)i,pt->firstline);
      i = (ptrdiff_t)lj_strfmt_wuleb128(pcVar4,pt->numline);
    }
  }
  pcVar4 = bcwrite_bytecode(ctx,(char *)i,pt);
  bVar1 = pt->sizeuv;
  memcpy(pcVar4,(void *)(pt->uv).ptr64,(ulong)bVar1 << 1);
  (ctx->sb).w = pcVar4 + (ulong)bVar1 * 2;
  bcwrite_kgc(ctx,pt);
  bcwrite_knum(ctx,pt);
  if (p._4_4_ != 0) {
    if ((uint)((int)(ctx->sb).e - (int)(ctx->sb).w) < p._4_4_) {
      local_10 = lj_buf_more2(&ctx->sb,p._4_4_);
    }
    else {
      local_10 = (ctx->sb).w;
    }
    memcpy(local_10,(void *)(pt->lineinfo).ptr64,(ulong)p._4_4_);
    (ctx->sb).w = local_10 + p._4_4_;
  }
  if (ctx->status == 0) {
    uVar2 = ((int)(ctx->sb).w - (int)(ctx->sb).b) - 5;
    iVar3 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    pcVar4 = (ctx->sb).b + (5 - ((uint)((iVar3 + 8) * 9) >> 6));
    lj_strfmt_wuleb128(pcVar4,uVar2);
    iVar3 = (*ctx->wfunc)((lua_State *)((ctx->sb).L.ptr64 & 0xfffffffffffffff8),pcVar4,(size_t)uVar2
                          ,ctx->wdata);
    ctx->status = iVar3;
  }
  return;
}

Assistant:

static void bcwrite_proto(BCWriteCtx *ctx, GCproto *pt)
{
  MSize sizedbg = 0;
  char *p;

  /* Recursively write children of prototype. */
  if ((pt->flags & PROTO_CHILD)) {
    ptrdiff_t i, n = pt->sizekgc;
    GCRef *kr = mref(pt->k, GCRef) - 1;
    for (i = 0; i < n; i++, kr--) {
      GCobj *o = gcref(*kr);
      if (o->gch.gct == ~LJ_TPROTO)
	bcwrite_proto(ctx, gco2pt(o));
    }
  }

  /* Start writing the prototype info to a buffer. */
  p = lj_buf_need(&ctx->sb,
		  5+4+6*5+(pt->sizebc-1)*(MSize)sizeof(BCIns)+pt->sizeuv*2);
  p += 5;  /* Leave room for final size. */

  /* Write prototype header. */
  *p++ = (pt->flags & (PROTO_CHILD|PROTO_VARARG|PROTO_FFI));
  *p++ = pt->numparams;
  *p++ = pt->framesize;
  *p++ = pt->sizeuv;
  p = lj_strfmt_wuleb128(p, pt->sizekgc);
  p = lj_strfmt_wuleb128(p, pt->sizekn);
  p = lj_strfmt_wuleb128(p, pt->sizebc-1);
  if (!ctx->strip) {
    if (proto_lineinfo(pt))
      sizedbg = pt->sizept - (MSize)((char *)proto_lineinfo(pt) - (char *)pt);
    p = lj_strfmt_wuleb128(p, sizedbg);
    if (sizedbg) {
      p = lj_strfmt_wuleb128(p, pt->firstline);
      p = lj_strfmt_wuleb128(p, pt->numline);
    }
  }

  /* Write bytecode instructions and upvalue refs. */
  p = bcwrite_bytecode(ctx, p, pt);
  p = lj_buf_wmem(p, proto_uv(pt), pt->sizeuv*2);
  ctx->sb.w = p;

  /* Write constants. */
  bcwrite_kgc(ctx, pt);
  bcwrite_knum(ctx, pt);

  /* Write debug info, if not stripped. */
  if (sizedbg) {
    p = lj_buf_more(&ctx->sb, sizedbg);
    p = lj_buf_wmem(p, proto_lineinfo(pt), sizedbg);
    ctx->sb.w = p;
  }

  /* Pass buffer to writer function. */
  if (ctx->status == 0) {
    MSize n = sbuflen(&ctx->sb) - 5;
    MSize nn = (lj_fls(n)+8)*9 >> 6;
    char *q = ctx->sb.b + (5 - nn);
    p = lj_strfmt_wuleb128(q, n);  /* Fill in final size. */
    lj_assertBCW(p == ctx->sb.b + 5, "bad ULEB128 write");
    ctx->status = ctx->wfunc(sbufL(&ctx->sb), q, nn+n, ctx->wdata);
  }
}